

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingCompressionState<unsigned_long,_false,_long>::BitpackingWriter::WriteFor
               (unsigned_long *values,bool *validity,bitpacking_width_t width,
               unsigned_long frame_of_reference,idx_t count,void *data_ptr)

{
  atomic<unsigned_long> *paVar1;
  unsigned_long *puVar2;
  idx_t iVar3;
  pointer pCVar4;
  undefined7 in_register_00000011;
  
  iVar3 = BitpackingPrimitives::GetRequiredSize(count,width);
  ReserveSpace((BitpackingCompressionState<unsigned_long,_false,_long> *)data_ptr,iVar3 + 0x10);
  WriteMetaData((BitpackingCompressionState<unsigned_long,_false,_long> *)data_ptr,FOR);
  puVar2 = *(unsigned_long **)((long)data_ptr + 0x40);
  *puVar2 = frame_of_reference;
  puVar2[1] = CONCAT71(in_register_00000011,width) & 0xffffffff;
  *(unsigned_long **)((long)data_ptr + 0x40) = puVar2 + 2;
  BitpackingPrimitives::PackBuffer<unsigned_long,false>((data_ptr_t)(puVar2 + 2),values,count,width)
  ;
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + iVar3;
  pCVar4 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                       *)((long)data_ptr + 0x20));
  LOCK();
  paVar1 = &(pCVar4->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + count;
  UNLOCK();
  return;
}

Assistant:

static void WriteFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference, idx_t count,
		                     void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 2 * sizeof(T));

			WriteMetaData(state, BitpackingMode::FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, (T)width);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}